

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O3

void cleanup_names(void)

{
  char **p;
  long lVar1;
  char *str;
  long lVar2;
  
  lVar1 = 0;
  do {
    p = name_sections[lVar1];
    str = *p;
    if (str != (char *)0x0) {
      lVar2 = 8;
      do {
        string_free(str);
        p = name_sections[lVar1];
        str = *(char **)((long)p + lVar2);
        lVar2 = lVar2 + 8;
      } while (str != (char *)0x0);
    }
    mem_free(p);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  mem_free(name_sections);
  return;
}

Assistant:

static void cleanup_names(void)
{
	int i, j;
	for (i = 0; i < RANDNAME_NUM_TYPES; i++) {
		for (j = 0; name_sections[i][j]; j++) {
			string_free((char *)name_sections[i][j]);
		}
		mem_free(name_sections[i]);
	}
	mem_free(name_sections);
}